

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void __thiscall MemoryLeakWarningReporter::fail(MemoryLeakWarningReporter *this,char *fail_string)

{
  UtestShell *message;
  char *fileName;
  SimpleString *this_00;
  UtestShell *currentTest;
  UtestShell *in_stack_ffffffffffffff18;
  undefined1 *puVar1;
  UtestShell *in_stack_ffffffffffffff48;
  FailFailure *in_stack_ffffffffffffff50;
  undefined1 local_90 [16];
  undefined1 local_80 [104];
  UtestShell *local_18;
  
  message = UtestShell::getCurrent();
  puVar1 = local_90;
  local_18 = message;
  UtestShell::getName(in_stack_ffffffffffffff18);
  fileName = SimpleString::asCharString((SimpleString *)0x16e222);
  this_00 = (SimpleString *)UtestShell::getLineNumber(local_18);
  SimpleString::SimpleString(this_00,(char *)in_stack_ffffffffffffff18);
  FailFailure::FailFailure
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,fileName,(size_t)puVar1,
             (SimpleString *)message);
  puVar1 = &stack0xffffffffffffff48;
  TestTerminatorWithoutExceptions::TestTerminatorWithoutExceptions
            ((TestTerminatorWithoutExceptions *)this_00);
  (*message->_vptr_UtestShell[0x27])(message,local_80,puVar1);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
            ((TestTerminatorWithoutExceptions *)0x16e2ae);
  FailFailure::~FailFailure((FailFailure *)0x16e2b8);
  SimpleString::~SimpleString((SimpleString *)0x16e2c2);
  SimpleString::~SimpleString((SimpleString *)0x16e2cc);
  return;
}

Assistant:

virtual void fail(char* fail_string) _override
    {
        UtestShell* currentTest = UtestShell::getCurrent();
        currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(), currentTest->getLineNumber(), fail_string), TestTerminatorWithoutExceptions());
    }